

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

int s2pred::ExpensiveSign(S2Point *a,S2Point *b,S2Point *c,bool perturb)

{
  bool bVar1;
  int det_sign;
  bool perturb_local;
  S2Point *c_local;
  S2Point *b_local;
  S2Point *a_local;
  
  bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                    ((BasicVector<Vector3,_double,_3UL> *)a,b);
  if (((bVar1) ||
      (bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                         ((BasicVector<Vector3,_double,_3UL> *)b,c), bVar1)) ||
     (bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                        ((BasicVector<Vector3,_double,_3UL> *)c,a), bVar1)) {
    a_local._4_4_ = 0;
  }
  else {
    a_local._4_4_ = StableSign(a,b,c);
    if (a_local._4_4_ == 0) {
      a_local._4_4_ = ExactSign(a,b,c,perturb);
    }
  }
  return a_local._4_4_;
}

Assistant:

int ExpensiveSign(const S2Point& a, const S2Point& b, const S2Point& c,
                  bool perturb) {
  // Return zero if and only if two points are the same.  This ensures (1).
  if (a == b || b == c || c == a) return 0;

  // Next we try recomputing the determinant still using floating-point
  // arithmetic but in a more precise way.  This is more expensive than the
  // simple calculation done by TriageSign(), but it is still *much* cheaper
  // than using arbitrary-precision arithmetic.  This optimization is able to
  // compute the correct determinant sign in virtually all cases except when
  // the three points are truly collinear (e.g., three points on the equator).
  int det_sign = StableSign(a, b, c);
  if (det_sign != 0) return det_sign;

  // TODO(ericv): Create a templated version of StableSign so that we can
  // retry in "long double" precision before falling back to ExactFloat.

  // TODO(ericv): Optimize ExactFloat so that it stores up to 32 bytes of
  // mantissa inline (without requiring memory allocation).

  // Otherwise fall back to exact arithmetic and symbolic permutations.
  return ExactSign(a, b, c, perturb);
}